

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

ON_Interval __thiscall ON_PolyCurve::SegmentDomain(ON_PolyCurve *this,int segment_index)

{
  double *pdVar1;
  ON_Interval OVar2;
  ON_Interval domain;
  ON_Interval local_20;
  
  ON_Interval::ON_Interval(&local_20);
  if ((-1 < segment_index) &&
     (segment_index < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
    pdVar1 = (this->m_t).m_a;
    local_20.m_t[0] = pdVar1[(uint)segment_index];
    local_20.m_t[1] = pdVar1[(ulong)(uint)segment_index + 1];
  }
  OVar2.m_t[0] = local_20.m_t[0];
  OVar2.m_t[1] = local_20.m_t[1];
  return (ON_Interval)OVar2.m_t;
}

Assistant:

ON_Interval 
ON_PolyCurve::SegmentDomain( int segment_index ) const
{
  ON_Interval domain;
  if ( segment_index >= 0 && segment_index < Count() ) {
    domain.m_t[0] = m_t[segment_index];
    domain.m_t[1] = m_t[segment_index+1];
  }
  return domain;
}